

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawShader::FBarShader::FBarShader(FBarShader *this,bool vertical,bool reverse)

{
  BYTE BVar1;
  long lVar2;
  undefined7 in_register_00000031;
  WORD WVar3;
  bool bVar4;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FTexture_007e4db8;
  bVar4 = (int)CONCAT71(in_register_00000031,vertical) != 0;
  WVar3 = 0x100;
  if (bVar4) {
    WVar3 = 2;
  }
  (this->super_FTexture).Width = WVar3;
  WVar3 = 2;
  if (bVar4) {
    WVar3 = 0x100;
  }
  (this->super_FTexture).Height = WVar3;
  FTexture::CalcBitSize(&this->super_FTexture);
  if (vertical) {
    if (reverse) {
      BVar1 = 0xff;
      for (lVar2 = -0x100; lVar2 != 0; lVar2 = lVar2 + 1) {
        this->Pixels[lVar2 + 0x100] = BVar1;
        *(BYTE *)((long)&this->DummySpan[0].TopOffset + lVar2) = BVar1;
        BVar1 = BVar1 + 0xff;
      }
    }
    else {
      for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
        this->Pixels[lVar2] = (BYTE)lVar2;
        this->Pixels[lVar2 + 0x100] = (BYTE)lVar2;
      }
    }
  }
  else if (reverse) {
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      this->Pixels[lVar2 * 2] = (BYTE)lVar2;
      this->Pixels[lVar2 * 2 + 1] = (BYTE)lVar2;
    }
  }
  else {
    BVar1 = 0xff;
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      this->Pixels[lVar2 * 2] = BVar1;
      this->Pixels[lVar2 * 2 + 1] = BVar1;
      BVar1 = BVar1 + 0xff;
    }
  }
  this->DummySpan[0].TopOffset = 0;
  this->DummySpan[0].Length = WVar3;
  this->DummySpan[1].TopOffset = 0;
  this->DummySpan[1].Length = 0;
  return;
}

Assistant:

FBarShader(bool vertical, bool reverse)
			{
				int i;

				Width = vertical ? 2 : 256;
				Height = vertical ? 256 : 2;
				CalcBitSize();

				// Fill the column/row with shading values.
				// Vertical shaders have have minimum alpha at the top
				// and maximum alpha at the bottom, unless flipped by
				// setting reverse to true. Horizontal shaders are just
				// the opposite.
				if (vertical)
				{
					if (!reverse)
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i] = i;
							Pixels[256+i] = i;
						}
					}
					else
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i] = 255 - i;
							Pixels[256+i] = 255 -i;
						}
					}
				}
				else
				{
					if (!reverse)
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i*2] = 255 - i;
							Pixels[i*2+1] = 255 - i;
						}
					}
					else
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i*2] = i;
							Pixels[i*2+1] = i;
						}
					}
				}
				DummySpan[0].TopOffset = 0;
				DummySpan[0].Length = vertical ? 256 : 2;
				DummySpan[1].TopOffset = 0;
				DummySpan[1].Length = 0;
			}